

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestMemCheckHandler::ProcessMemCheckBoundsCheckerOutput
          (cmCTestMemCheckHandler *this,string *str,string *log,
          vector<int,_std::allocator<int>_> *results)

{
  string *psVar1;
  int *piVar2;
  cmCTest *pcVar3;
  pointer piVar4;
  pointer pbVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  ostream *poVar9;
  ulong uVar10;
  long lVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  cmDuration local_248 [4];
  string *local_228;
  long local_220;
  vector<int,_std::allocator<int>_> *local_218;
  cmBoundsCheckerParser parser;
  ostringstream cmCTestLog_msg;
  
  log->_M_string_length = 0;
  *(log->_M_dataplus)._M_p = '\0';
  lVar8 = std::chrono::_V2::steady_clock::now();
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmsys::SystemTools::Split(str,&lines);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar9 = std::operator<<((ostream *)&cmCTestLog_msg,"Start test: ");
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::endl<char,std::char_traits<char>>(poVar9);
  pcVar3 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  local_228 = log;
  local_218 = results;
  cmCTest::Log(pcVar3,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x448,(char *)parser.super_cmXMLParser._vptr_cmXMLParser,
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  std::__cxx11::string::~string((string *)&parser);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  lVar11 = 0x20;
  uVar10 = 1;
  while( true ) {
    if ((ulong)((long)lines.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)lines.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar10 - 1) break;
    bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&lines.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus._M_p +
                            lVar11),"******######*****Begin BOUNDS CHECKER XML******######******");
    if (bVar6) break;
    lVar11 = lVar11 + 0x20;
    uVar10 = uVar10 + 1;
  }
  local_220 = lVar8;
  cmBoundsCheckerParser::cmBoundsCheckerParser
            (&parser,(this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
  cmXMLParser::InitializeParser(&parser.super_cmXMLParser);
  if (uVar10 - 1 <
      (ulong)((long)lines.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)lines.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    for (; pbVar5 = lines.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
        uVar10 < (ulong)((long)lines.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)lines.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5); uVar10 = uVar10 + 1)
    {
      psVar1 = (string *)
               ((long)&((lines.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar11);
      lVar8 = std::__cxx11::string::find((char *)psVar1,0x604161);
      if (lVar8 == -1) {
        iVar7 = cmXMLParser::ParseChunk
                          (&parser.super_cmXMLParser,
                           *(char **)((long)&(pbVar5->_M_dataplus)._M_p + lVar11),
                           *(size_type *)((long)&pbVar5->_M_string_length + lVar11));
        if (iVar7 == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          poVar9 = std::operator<<((ostream *)&cmCTestLog_msg,"Error in ParseChunk: ");
          poVar9 = std::operator<<(poVar9,psVar1);
          std::endl<char,std::char_traits<char>>(poVar9);
          pcVar3 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                       ,0x45a,(char *)local_248[0].__r,false);
          std::__cxx11::string::~string((string *)local_248);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        }
      }
      lVar11 = lVar11 + 0x20;
    }
  }
  lVar11 = local_220;
  piVar4 = (local_218->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = (long)parser.Errors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)parser.Errors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  for (; parser.Errors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_start !=
         parser.Errors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_finish;
      parser.Errors.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = parser.Errors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + 1) {
    piVar2 = piVar4 + *parser.Errors.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
    *piVar2 = *piVar2 + 1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar9 = std::operator<<((ostream *)&cmCTestLog_msg,"End test (elapsed: ");
  lVar8 = std::chrono::_V2::steady_clock::now();
  local_248[0].__r = (double)(lVar8 - lVar11) / 1000000000.0;
  cmDurationTo<unsigned_int>(local_248);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  poVar9 = std::operator<<(poVar9,"s)");
  std::endl<char,std::char_traits<char>>(poVar9);
  pcVar3 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x468,(char *)local_248[0].__r,
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  std::__cxx11::string::~string((string *)local_248);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  iVar7 = (int)(uVar10 >> 2);
  if (iVar7 != 0) {
    std::__cxx11::string::_M_assign((string *)local_228);
  }
  this->DefectCount = this->DefectCount + iVar7;
  cmBoundsCheckerParser::~cmBoundsCheckerParser(&parser);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&lines);
  return iVar7 == 0;
}

Assistant:

bool cmCTestMemCheckHandler::ProcessMemCheckBoundsCheckerOutput(
  const std::string& str, std::string& log, std::vector<int>& results)
{
  log.clear();
  auto sttime = std::chrono::steady_clock::now();
  std::vector<std::string> lines;
  cmsys::SystemTools::Split(str, lines);
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "Start test: " << lines.size() << std::endl, this->Quiet);
  std::vector<std::string>::size_type cc;
  for (cc = 0; cc < lines.size(); cc++) {
    if (lines[cc] == BOUNDS_CHECKER_MARKER) {
      break;
    }
  }
  cmBoundsCheckerParser parser(this->CTest);
  parser.InitializeParser();
  if (cc < lines.size()) {
    for (cc++; cc < lines.size(); ++cc) {
      std::string& theLine = lines[cc];
      // check for command line arguments that are not escaped
      // correctly by BC
      if (theLine.find("TargetArgs=") != std::string::npos) {
        // skip this because BC gets it wrong and we can't parse it
      } else if (!parser.ParseChunk(theLine.c_str(), theLine.size())) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Error in ParseChunk: " << theLine << std::endl);
      }
    }
  }
  int defects = 0;
  for (int err : parser.Errors) {
    results[err]++;
    defects++;
  }
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "End test (elapsed: "
                       << cmDurationTo<unsigned int>(
                            std::chrono::steady_clock::now() - sttime)
                       << "s)" << std::endl,
                     this->Quiet);
  if (defects) {
    // only put the output of Bounds Checker if there were
    // errors or leaks detected
    log = parser.Log;
  }
  this->DefectCount += defects;
  return defects == 0;
}